

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O0

Matrix<double,__1,_1,_0,__1,_1> __thiscall
lf::assemble::COOMatrix<double>::MatVecMult<Eigen::Matrix<double,_1,1,0,_1,1>>
          (COOMatrix<double> *this,double alpha,Matrix<double,__1,_1,_0,__1,_1> *vec)

{
  double dVar1;
  double dVar2;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar3;
  bool bVar4;
  Index IVar5;
  ostream *poVar6;
  Index *this_01;
  reference this_02;
  double *pdVar7;
  int *piVar8;
  CoeffReturnType pdVar9;
  Scalar *pSVar10;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RDX;
  Index extraout_RDX;
  Matrix<double,__1,_1,_0,__1,_1> MVar11;
  Triplet *trp;
  const_iterator __end0;
  const_iterator __begin0;
  TripletVec *__range3;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_28;
  Matrix<double,__1,_1,_0,__1,_1> *vec_local;
  double alpha_local;
  COOMatrix<double> *this_local;
  VectorXd *result;
  
  local_28 = in_RDX;
  vec_local = (Matrix<double,__1,_1,_0,__1,_1> *)alpha;
  alpha_local = (double)vec;
  this_local = this;
  IVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(in_RDX);
  if ((long)(ulong)*(uint *)((long)&(vec->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data + 4) <= IVar5) {
    __range3._6_1_ = 0;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)this,(uint *)vec);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
    this_01 = &(vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
    __end0 = std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
             ::begin((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                      *)this_01);
    trp = (Triplet *)
          std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
          end((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
              this_01);
    while (bVar4 = __gnu_cxx::
                   operator==<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                             (&__end0,(__normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                       *)&trp), ((bVar4 ^ 0xffU) & 1) != 0) {
      this_02 = __gnu_cxx::
                __normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                ::operator*(&__end0);
      pdVar7 = Eigen::Triplet<double,_int>::value(this_02);
      pMVar3 = vec_local;
      this_00 = local_28;
      dVar1 = *pdVar7;
      piVar8 = Eigen::Triplet<double,_int>::col(this_02);
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,
                          (long)*piVar8);
      dVar2 = *pdVar9;
      piVar8 = Eigen::Triplet<double,_int>::row(this_02);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                           (long)*piVar8);
      *pSVar10 = dVar1 * (double)pMVar3 * dVar2 + *pSVar10;
      __gnu_cxx::
      __normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
      ::operator++(&__end0);
    }
    MVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    MVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (Matrix<double,__1,_1,_0,__1,_1>)
           MVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar6 = std::operator<<(local_1a0,"size mismatch: ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,*(uint *)((long)&(vec->
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                              ).m_storage.m_data + 4));
  poVar6 = std::operator<<(poVar6," <-> ");
  IVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(local_28);
  std::ostream::operator<<(poVar6,IVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"vec.size() >= cols_",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,&local_209);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1e0,&local_208,0xef,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"",(allocator<char> *)((long)&__range3 + 7));
  lf::base::AssertionFailed(&local_250,&local_278,0xef,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  abort();
}

Assistant:

Eigen::Matrix<SCALAR, Eigen::Dynamic, 1> COOMatrix<SCALAR>::MatVecMult(
    SCALAR alpha, const VECTOR &vec) const {
  LF_ASSERT_MSG(vec.size() >= cols_,
                "size mismatch: " << cols_ << " <-> " << vec.size());
  Eigen::VectorXd result(rows_);
  result.setZero();
  for (const Triplet &trp : triplets_) {
    result[trp.row()] += trp.value() * (alpha * vec[trp.col()]);
  }
  return result;
}